

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O2

int run_test_udp_options6(void)

{
  int iVar1;
  short *psVar2;
  long lVar3;
  bool bVar4;
  int count;
  sockaddr_in6 addr;
  
  iVar1 = uv_interface_addresses((uv_interface_address_t **)&addr,&count);
  if (iVar1 == 0) {
    psVar2 = (short *)(addr._0_8_ + 0x14);
    bVar4 = false;
    for (lVar3 = 0; (!bVar4 && (lVar3 < count)); lVar3 = lVar3 + 1) {
      bVar4 = *psVar2 == 10;
      psVar2 = psVar2 + 0x28;
    }
    uv_free_interface_addresses((uv_interface_address_t *)addr._0_8_,count);
    if (bVar4) {
      iVar1 = uv_ip6_addr("::",0x23a3,&addr);
      if (iVar1 == 0) {
        udp_options_test((sockaddr *)&addr);
        return 0;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
              ,0x6d,"0 == uv_ip6_addr(\"::\", TEST_PORT, &addr)");
      abort();
    }
  }
  fprintf(_stderr,"%s\n","IPv6 not supported");
  fflush(_stderr);
  return 1;
}

Assistant:

TEST_IMPL(udp_options6) {
  struct sockaddr_in6 addr;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));
  return udp_options_test((const struct sockaddr*) &addr);
}